

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first.c
# Opt level: O0

int select_wrapper(int nfds,fd_set *rd,fd_set *wr,fd_set *exc,timeval *tv)

{
  int *piVar1;
  timeval *tv_local;
  fd_set *exc_local;
  fd_set *wr_local;
  fd_set *rd_local;
  int nfds_local;
  
  if (nfds < 0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    rd_local._4_4_ = -1;
  }
  else {
    rd_local._4_4_ = select(nfds,(fd_set *)rd,(fd_set *)wr,(fd_set *)exc,(timeval *)tv);
  }
  return rd_local._4_4_;
}

Assistant:

int select_wrapper(int nfds, fd_set *rd, fd_set *wr, fd_set *exc,
                   struct timeval *tv)
{
  if(nfds < 0) {
    SET_SOCKERRNO(EINVAL);
    return -1;
  }
#ifdef USE_WINSOCK
  /*
   * Winsock select() requires that at least one of the three fd_set
   * pointers is not NULL and points to a non-empty fdset. IOW Winsock
   * select() can not be used to sleep without a single fd_set.
   */
  if(!nfds) {
    Sleep(1000*tv->tv_sec + tv->tv_usec/1000);
    return 0;
  }
#endif
  return select(nfds, rd, wr, exc, tv);
}